

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

void testing::internal::CaptureStream(int fd,char *stream_name,CapturedStream **stream)

{
  ostream *poVar1;
  void *pvVar2;
  long *in_RDX;
  char *in_RSI;
  int in_stack_0000000c;
  CapturedStream *in_stack_00000010;
  int in_stack_0000001c;
  char *in_stack_00000020;
  GTestLogSeverity in_stack_0000002c;
  GTestLog *in_stack_00000030;
  GTestLog *in_stack_ffffffffffffffb0;
  GTestLog local_1c;
  long *local_18;
  char *local_10;
  
  local_18 = in_RDX;
  if (*in_RDX != 0) {
    local_10 = in_RSI;
    GTestLog::GTestLog(in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
    poVar1 = GTestLog::GetStream(&local_1c);
    poVar1 = std::operator<<(poVar1,"Only one ");
    poVar1 = std::operator<<(poVar1,local_10);
    std::operator<<(poVar1," capturer can exist at a time.");
    GTestLog::~GTestLog(in_stack_ffffffffffffffb0);
  }
  pvVar2 = operator_new(0x28);
  CapturedStream::CapturedStream(in_stack_00000010,in_stack_0000000c);
  *local_18 = (long)pvVar2;
  return;
}

Assistant:

static void CaptureStream(int fd, const char* stream_name,
                          CapturedStream** stream) {
  if (*stream != nullptr) {
    GTEST_LOG_(FATAL) << "Only one " << stream_name
                      << " capturer can exist at a time.";
  }
  *stream = new CapturedStream(fd);
}